

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_nullwindow.c
# Opt level: O3

short SEARCH_nullwindow(chess_state_t *state,search_state_t *search_state,uchar depth,uchar ply,
                       move_t *move,short beta)

{
  int *piVar1;
  byte bVar2;
  move_t mVar3;
  bool bVar4;
  pv_line_t *ppVar5;
  pv_line_t *ppVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  int iVar10;
  uint num_moves;
  int64_t iVar11;
  transposition_entry_t *ptVar12;
  char cVar13;
  undefined7 in_register_00000009;
  ulong uVar14;
  byte depth_00;
  uint uVar15;
  ulong uVar16;
  chess_state_t *moves;
  ulong uVar17;
  move_t next_move_1;
  bitboard_t pinned;
  bitboard_t pinners;
  bitboard_t block_check;
  move_t next_move;
  chess_state_t next_state;
  uchar local_530;
  short local_518;
  move_t local_514;
  ulong local_510;
  int (*local_508) [64] [64];
  move_t (*local_500) [2];
  pv_line_t *local_4f8;
  move_t *local_4f0;
  pv_line_t *local_4e8;
  bitboard_t local_4e0;
  bitboard_t local_4d8;
  bitboard_t local_4d0;
  chess_state_t local_4c8;
  chess_state_t local_438 [7];
  
  *move = 0;
  search_state->pv_table[CONCAT71(in_register_00000009,ply) & 0xffffffff].size = 0;
  iVar9 = search_state->next_clock_check;
  search_state->next_clock_check = iVar9 + -1;
  if (iVar9 < 2) {
    search_state->next_clock_check = 10000;
    iVar11 = CLOCK_time_passed(search_state->start_time_ms);
    if (search_state->time_for_move_ms <= iVar11) {
      search_state->abort_search = 1;
    }
  }
  if (search_state->abort_search != 0) {
    return 0;
  }
  uVar14 = 100;
  if (ply < 100) {
    uVar14 = (ulong)ply;
  }
  iVar9 = STATE_checkers_and_pinners(state,&local_4d0,&local_4d8,&local_4e0);
  depth_00 = (depth + '\x01') - (iVar9 == 0);
  if (depth_00 == 0) {
    sVar8 = SEARCH_nullwindow_quiescence(state,search_state,beta);
    return sVar8;
  }
  ptVar12 = HASHTABLE_transition_retrieve(search_state->hashtable,state->hash);
  if (ptVar12 != (transposition_entry_t *)0x0) {
    mVar3 = ptVar12->best_move;
    *move = mVar3;
    bVar2 = ptVar12->depth;
    if (depth_00 <= bVar2) {
      sVar8 = ptVar12->score;
      if (ptVar12->type == '\x01') {
        if (beta <= sVar8) goto LAB_0010523b;
        if (sVar8 < -999) {
          sVar8 = sVar8 + ((ushort)bVar2 - (ushort)depth_00);
        }
      }
      else {
        if (sVar8 < beta) goto LAB_0010523b;
        if (999 < sVar8) {
          sVar8 = sVar8 + ((ushort)depth_00 - (ushort)bVar2);
        }
      }
      if (mVar3 != 0) {
        return sVar8;
      }
      if (state->last_move != 0) {
        return sVar8;
      }
    }
  }
LAB_0010523b:
  sVar8 = -1000 - (ushort)depth_00;
  if ((((4 < depth_00) && (iVar9 == 0)) && (state->last_move != 0)) &&
     (iVar10 = STATE_risk_zugzwang(state), iVar10 == 0)) {
    memcpy(local_438,state,0x90);
    STATE_apply_move(local_438,0);
    sVar7 = SEARCH_nullwindow(local_438,search_state,(depth == '\x05') + depth + 0xfc,
                              (char)uVar14 + '\x01',(move_t *)&local_4c8,1 - beta);
    if (beta <= -sVar7) {
      sVar8 = beta;
    }
  }
  if (sVar8 < beta) {
    moves = local_438;
    num_moves = STATE_generate_moves(state,iVar9,local_4d0,local_4d8,local_4e0,(move_t *)moves);
    local_500 = search_state->killer_move + uVar14;
    MOVEORDER_rate_moves
              (state,(move_t *)moves,num_moves,*move,*local_500,
               search_state->history_heuristic[state->player]);
    bVar4 = false;
    if ((iVar9 == 0) && (depth_00 < 4)) {
      sVar7 = EVAL_evaluate_board(state);
      bVar4 = (int)sVar7 + *(int *)(&DAT_0010b280 + (ulong)depth * 4) < (int)beta;
    }
    if (0 < (int)num_moves) {
      local_508 = search_state->history_heuristic;
      local_530 = depth_00 - 1;
      local_518 = 1 - beta;
      local_4e8 = search_state->pv_table + uVar14;
      local_4f0 = search_state->pv_table[uVar14].moves + 1;
      local_510 = (ulong)(byte)((char)uVar14 + 1);
      local_4f8 = search_state->pv_table + local_510;
      uVar17 = (ulong)num_moves;
      uVar16 = 0;
      sVar7 = sVar8;
      do {
        MOVEORDER_best_move_first((move_t *)moves,(int)uVar17);
        mVar3 = (move_t)moves->bitboard[0];
        memcpy(&local_4c8,state,0x90);
        STATE_apply_move(&local_4c8,mVar3);
        uVar15 = mVar3 & 0x300000;
        if ((uVar15 != 0 || (uVar16 < 2 || !bVar4)) ||
           (iVar10 = SEARCH_is_check(&local_4c8,(uint)local_4c8.player), iVar10 != 0)) {
          HISTORY_push(search_state->history,local_4c8.hash);
          iVar10 = HISTORY_is_repetition(search_state->history,(int)local_4c8.halfmove_clock);
          if ((iVar10 == 0) && (iVar10 = EVAL_draw(&local_4c8), iVar10 == 0)) {
            if (((2 < depth_00) && (3 < uVar16)) && (uVar15 == 0 && iVar9 == 0)) {
              cVar13 = (uVar16 < 0x10 || depth_00 < 5) + -3;
              if (uVar16 < 0xc) {
                cVar13 = -1;
              }
              if (depth_00 < 4) {
                cVar13 = -1;
              }
              sVar8 = SEARCH_nullwindow(&local_4c8,search_state,cVar13 + local_530,(uchar)local_510,
                                        &local_514,local_518);
              sVar8 = -sVar8;
              if (sVar8 <= sVar7) goto LAB_001055a5;
            }
            sVar8 = SEARCH_nullwindow(&local_4c8,search_state,local_530,(uchar)local_510,&local_514,
                                      local_518);
            sVar8 = -sVar8;
          }
          else {
            search_state->pv_table[uVar14 + 1].size = 0;
            sVar8 = 0;
          }
LAB_001055a5:
          HISTORY_pop(search_state->history);
          ppVar6 = local_4e8;
          ppVar5 = local_4f8;
          if (sVar7 < sVar8) {
            mVar3 = (move_t)moves->bitboard[0];
            *move = mVar3;
            local_4e8->moves[0] = mVar3;
            memcpy(local_4f0,local_4f8,(long)local_4f8->size << 2);
            ppVar6->size = ppVar5->size + 1;
            sVar7 = sVar8;
            if (beta <= sVar8) {
              uVar15 = *move;
              if ((uVar15 & 0x300000) == 0) {
                if (uVar15 != (*local_500)[0]) {
                  (*local_500)[1] = (*local_500)[0];
                  uVar15 = *move;
                  (*local_500)[0] = uVar15;
                }
                piVar1 = (int *)((long)local_508[state->player][0] +
                                (ulong)(uVar15 >> 4 & 0xfc) + (ulong)((uVar15 & 0x3f) << 8));
                *piVar1 = *piVar1 + (uint)depth_00 * (uint)depth_00;
              }
              break;
            }
          }
        }
        sVar8 = sVar7;
        uVar16 = uVar16 + 1;
        moves = (chess_state_t *)((long)moves->bitboard + 4);
        uVar17 = uVar17 - 1;
        sVar7 = sVar8;
      } while (uVar17 != 0);
    }
    if (num_moves == 0 && iVar9 == 0) {
      sVar8 = 0;
    }
  }
  if (search_state->abort_search == 0) {
    HASHTABLE_transition_store
              (search_state->hashtable,state->hash,depth_00,sVar8 < beta,sVar8,*move);
  }
  return sVar8;
}

Assistant:

short SEARCH_nullwindow(const chess_state_t *state, search_state_t *search_state, unsigned char depth, unsigned char ply, move_t *move, short beta)
{
    *move = 0;
    search_state->pv_table[ply].size = 0;

    /* Check if time is up */
    search_state->next_clock_check--;
    if(search_state->next_clock_check <= 0) {
        search_state->next_clock_check = SEARCH_ITERATIONS_BETWEEN_CLOCK_CHECK;
        if(CLOCK_time_passed(search_state->start_time_ms) >= search_state->time_for_move_ms) {
            search_state->abort_search = 1;
        }
    }
    if(search_state->abort_search) {
        return 0;
    }

    if(ply > MAX_SEARCH_DEPTH) ply = MAX_SEARCH_DEPTH;

    /* We will query the transition table soon, time to prefetch */
    HASHTABLE_transition_prefetch(search_state->hashtable, state->hash);

    /* Is playing side in check? */
    bitboard_t block_check, pinners, pinned;
    int num_checkers = STATE_checkers_and_pinners(state, &block_check, &pinners, &pinned);

    /* Check extension */
    if(num_checkers) {
        depth += 1;
    }

    /* Quiescence search */
    if(depth == 0) {
        return SEARCH_nullwindow_quiescence(state, search_state, beta);
    }

    /* Query the transposition table */
    int cutoff = 0;
    short ttable_score = SEARCH_transpositiontable_retrieve(search_state->hashtable, state->hash, depth, beta, move, &cutoff);
    if(cutoff) {
        if(*move || state->last_move) {
            return ttable_score;
        }
    }

    short best_score = SEARCH_MIN_RESULT(depth);

    /* Null move pruning */
    if(depth > 4 && state->last_move && !num_checkers && !STATE_risk_zugzwang(state)) {
        unsigned char R_plus_1 = ((depth > 5) ? 4 : 3);
        chess_state_t next_state = *state;
        STATE_apply_move(&next_state, 0);
        move_t next_move;
        short score = -SEARCH_nullwindow(&next_state, search_state, depth-R_plus_1, ply+1, &next_move, -beta+1);
        if(score >= beta) {
            best_score = beta;
        }
    }

    if(best_score < beta) {
        /* Generate and rate moves */
        move_t moves[256];
        int num_moves = STATE_generate_moves(state, num_checkers, block_check, pinners, pinned, moves);
        MOVEORDER_rate_moves(state, moves, num_moves, *move, search_state->killer_move[ply], search_state->history_heuristic[state->player]);

        /* Check if node is eligible for futility pruning */
        int do_futility_pruning = 0;
        if(depth <= 3 && !num_checkers) {
            const int margin[4] = { 0, 20, 25, 30 };
            if(beta > EVAL_evaluate_board(state) + margin[depth]) {
                do_futility_pruning = 1;
            }
        }

        /* Iterate over all moves */
        for(int i = 0; i < num_moves; i++) {
            /* Pick move with the highest score */
            MOVEORDER_best_move_first(&moves[i], num_moves - i);

            short score = SEARCH_move(state, search_state, depth, ply, moves[i], i, do_futility_pruning, num_checkers, best_score, beta);

            /* Check if score improved by this move */
            if(score > best_score) {
                best_score = score;
                *move = moves[i];

                search_state->pv_table[ply].moves[0] = *move;
                memcpy(&search_state->pv_table[ply].moves[1], search_state->pv_table[ply+1].moves, search_state->pv_table[ply+1].size * sizeof(move_t));
                search_state->pv_table[ply].size = 1 + search_state->pv_table[ply+1].size;

                /* Beta-cuttoff */
                if(best_score >= beta) {
                    if(!MOVE_IS_CAPTURE_OR_PROMOTION(*move)) {
                        /* Killer move */
                        if(*move != search_state->killer_move[ply][0]) {
                            search_state->killer_move[ply][1] = search_state->killer_move[ply][0];
                            search_state->killer_move[ply][0] = *move;
                        }
                        /* History heuristic */
                        search_state->history_heuristic[state->player][MOVE_GET_POS_FROM(*move)][MOVE_GET_POS_TO(*move)] += depth*depth;
                    }
                    break;
                }
            }
        }

        /* Detect checkmate and stalemate */
        if(num_moves == 0) {
            if(num_checkers) {
                /* Checkmate (worst case) */
            } else {
                /* Stalemate */
                best_score = 0;
            }
        }
    }

    /* Store the result in the transposition table */
    if(!search_state->abort_search) {
        SEARCH_transpositiontable_store(search_state->hashtable, state->hash, depth, best_score, *move, beta);
    }

    /* Return score */
    return best_score;
}